

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_ai_way.cxx
# Opt level: O1

void __thiscall
xray_re::mp_rpoint_io::operator()(mp_rpoint_io *this,mp_rpoint **_rpoint,xr_reader *r)

{
  float *pfVar1;
  mp_rpoint *pmVar2;
  
  pmVar2 = (mp_rpoint *)operator_new(0x1c);
  *_rpoint = pmVar2;
  pfVar1 = (float *)(r->field_2).m_p_u32;
  (r->field_2).m_p = (uint8_t *)(pfVar1 + 1);
  (pmVar2->p).field_0.field_0.x = *pfVar1;
  (r->field_2).m_p = (uint8_t *)(pfVar1 + 2);
  (pmVar2->p).field_0.field_0.y = pfVar1[1];
  (r->field_2).m_p = (uint8_t *)(pfVar1 + 3);
  (pmVar2->p).field_0.field_0.z = pfVar1[2];
  (r->field_2).m_p = (uint8_t *)(pfVar1 + 4);
  (pmVar2->a).field_0.field_0.x = pfVar1[3];
  (r->field_2).m_p = (uint8_t *)(pfVar1 + 5);
  (pmVar2->a).field_0.field_0.y = pfVar1[4];
  (r->field_2).m_p = (uint8_t *)(pfVar1 + 6);
  (pmVar2->a).field_0.field_0.z = pfVar1[5];
  (r->field_2).m_p = (uint8_t *)((long)pfVar1 + 0x19);
  pmVar2->team = *(uint8_t *)(pfVar1 + 6);
  (r->field_2).m_p = (uint8_t *)((long)pfVar1 + 0x1a);
  pmVar2->respawn = *(uint8_t *)((long)pfVar1 + 0x19);
  (r->field_2).m_p = (uint8_t *)((long)pfVar1 + 0x1b);
  pmVar2->game = *(uint8_t *)((long)pfVar1 + 0x1a);
  (r->field_2).m_p = (uint8_t *)(pfVar1 + 7);
  if (pfVar1 + 7 <= r->m_end) {
    return;
  }
  __assert_fail("m_p <= m_end",
                "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_reader.h"
                ,0x7c,"void xray_re::xr_reader::advance(size_t)");
}

Assistant:

void mp_rpoint_io::operator()(mp_rpoint*& _rpoint, xr_reader& r) const
{
	mp_rpoint* rpoint = new mp_rpoint;
	_rpoint = rpoint;
	r.r_fvector3(rpoint->p);
	r.r_fvector3(rpoint->a);
	rpoint->team = r.r_u8();
	rpoint->respawn = r.r_u8();
	rpoint->game = r.r_u8();
	r.advance(sizeof(uint8_t));
}